

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::CheckPropertyCompatibility
          (cmGeneratorTarget *this,cmComputeLinkInformation *info,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmLocalGenerator *this_00;
  long lVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  ItemVector *pIVar7;
  pointer pIVar8;
  iterator iVar9;
  ulong uVar10;
  ostream *poVar11;
  pointer pIVar12;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string propsString;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMaxNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedMinNumbers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedStrings;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedBools;
  ostringstream e;
  key_type local_2e8;
  string local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  string local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [8];
  const_iterator local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pIVar7 = cmComputeLinkInformation::GetItems(info);
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strBool_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strBool_abi_cxx11_), iVar6 != 0)) {
    CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
    strBool_abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strBool_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strBool_abi_cxx11_,"COMPATIBLE_INTERFACE_BOOL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strBool_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strBool_abi_cxx11_);
  }
  local_208._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208._M_impl.super__Rb_tree_header._M_header;
  local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strString_abi_cxx11_), iVar6 != 0)) {
    CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
    strString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strString_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strString_abi_cxx11_,"COMPATIBLE_INTERFACE_STRING","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strString_abi_cxx11_);
  }
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strNumMin_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strNumMin_abi_cxx11_), iVar6 != 0)) {
    CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
    strNumMin_abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strNumMin_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strNumMin_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMin_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMin_abi_cxx11_);
  }
  local_268._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_268._M_impl.super__Rb_tree_header._M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._M_impl.super__Rb_tree_header._M_header._M_right =
       local_268._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
       strNumMax_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                                   ::strNumMax_abi_cxx11_), iVar6 != 0)) {
    CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
    strNumMax_abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strNumMax_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)::
                strNumMax_abi_cxx11_,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                  ::strNumMax_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                         ::strNumMax_abi_cxx11_);
  }
  pIVar12 = (pIVar7->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar8 = (pIVar7->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar12 != pIVar8) {
    do {
      if (pIVar12->Target != (cmGeneratorTarget *)0x0) {
        checkPropertyConsistency<bool>
                  (this,pIVar12->Target,
                   &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                    ::strBool_abi_cxx11_,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1d8,config,BoolType,(bool *)0x0);
        if (((((cmSystemTools::s_ErrorOccured != false) ||
              (cmSystemTools::s_FatalErrorOccured != false)) ||
             (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) ||
            ((((checkPropertyConsistency<char_const*>
                          (this,pIVar12->Target,
                           &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                            ::strString_abi_cxx11_,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_208,config,StringType,(char **)0x0),
               cmSystemTools::s_ErrorOccured != false ||
               (cmSystemTools::s_FatalErrorOccured != false)) ||
              ((bVar5 = cmSystemTools::GetInterruptFlag(), bVar5 ||
               ((checkPropertyConsistency<char_const*>
                           (this,pIVar12->Target,
                            &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                             ::strNumMin_abi_cxx11_,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_238,config,NumberMinType,(char **)0x0),
                cmSystemTools::s_ErrorOccured != false ||
                (cmSystemTools::s_FatalErrorOccured != false)))))) ||
             (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)))) ||
           (((checkPropertyConsistency<char_const*>
                        (this,pIVar12->Target,
                         &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                          ::strNumMax_abi_cxx11_,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_268,config,NumberMaxType,(char **)0x0),
             cmSystemTools::s_ErrorOccured != false || (cmSystemTools::s_FatalErrorOccured != false)
             ) || (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)))) goto LAB_0038157f;
        pIVar8 = (pIVar7->
                 super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      pIVar12 = pIVar12 + 1;
    } while (pIVar12 != pIVar8);
  }
  paVar1 = &local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  intersect((string *)local_1a8,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_208);
  std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1a8);
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0])
                    + 1);
  }
  if ((pointer)local_2c8._M_string_length == (pointer)0x0) {
    intersect((string *)local_1a8,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d8,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((pointer)local_2c8._M_string_length == (pointer)0x0) {
      intersect((string *)local_1a8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1d8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268);
      std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                 local_198[0]._M_local_buf[0]) + 1);
      }
      if ((pointer)local_2c8._M_string_length == (pointer)0x0) {
        local_1a0._M_current = (pointer)0x0;
        local_198[0]._M_local_buf[0] = '\0';
        local_1a8 = (undefined1  [8])local_198;
        intersect(&local_288,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_208,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_238);
        std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if (local_1a0._M_current == (pointer)0x0) {
          intersect(&local_288,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_208,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_268);
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if (local_1a0._M_current != (pointer)0x0) goto LAB_00381691;
          intersect(&local_2e8,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_238,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_268);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
        }
        else {
LAB_00381691:
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          if (local_1a8 == (undefined1  [8])local_198) {
            local_2e8.field_2._8_8_ = local_198[0]._8_8_;
          }
          else {
            local_2e8._M_dataplus._M_p = (pointer)local_1a8;
          }
          local_2e8.field_2._M_allocated_capacity._1_7_ = local_198[0]._M_allocated_capacity._1_7_;
          local_2e8.field_2._M_local_buf[0] = local_198[0]._M_local_buf[0];
          local_2e8._M_string_length = (size_type)local_1a0._M_current;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                   local_2c8.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00381294;
      }
    }
  }
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p == paVar1) {
    local_2e8.field_2._8_8_ = local_2c8.field_2._8_8_;
  }
  else {
    local_2e8._M_dataplus._M_p = local_2c8._M_dataplus._M_p;
  }
  local_2e8.field_2._M_allocated_capacity._1_7_ = local_2c8.field_2._M_allocated_capacity._1_7_;
  local_2e8.field_2._M_local_buf[0] = local_2c8.field_2._M_local_buf[0];
  local_2e8._M_string_length = local_2c8._M_string_length;
LAB_00381294:
  if ((pointer)local_2e8._M_string_length != (pointer)0x0) {
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_1d8,&local_2e8);
    if ((_Rb_tree_header *)iVar9._M_node != &local_1d8._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,
                  &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strBool_abi_cxx11_);
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_208,&local_2e8);
    if ((_Rb_tree_header *)iVar9._M_node != &local_208._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,
                  &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strString_abi_cxx11_);
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_238,&local_2e8);
    if ((_Rb_tree_header *)iVar9._M_node != &local_238._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,
                  &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strNumMin_abi_cxx11_);
    }
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_268,&local_2e8);
    if ((_Rb_tree_header *)iVar9._M_node != &local_268._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,
                  &CheckPropertyCompatibility(cmComputeLinkInformation*,std::__cxx11::string_const&)
                   ::strNumMax_abi_cxx11_);
    }
    pbVar4 = local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar10 = (long)local_2a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_2a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_2a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4);
    }
    local_1a8 = (undefined1  [8])
                local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_1a0._M_current =
         local_2a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_288,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_1a8,", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   " and the ",
                   local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_1a8);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198[0]._M_allocated_capacity._1_7_,local_198[0]._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Property \"",10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" appears in both the ",0x16);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," property in the dependencies of target \"",0x29);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(this->Target->Name)._M_dataplus._M_p,
                         (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               "\".  This is not allowed. A property may only require compatibility in a boolean interpretation, a numeric minimum, a numeric maximum or a string interpretation, but not a mixture."
               ,0xb3);
    this_00 = this->LocalGenerator;
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                               local_2c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
LAB_0038157f:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_268);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_208);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1d8);
  return;
}

Assistant:

void cmGeneratorTarget::CheckPropertyCompatibility(
    cmComputeLinkInformation *info, const std::string& config) const
{
  const cmComputeLinkInformation::ItemVector &deps = info->GetItems();

  std::set<std::string> emittedBools;
  static std::string strBool = "COMPATIBLE_INTERFACE_BOOL";
  std::set<std::string> emittedStrings;
  static std::string strString = "COMPATIBLE_INTERFACE_STRING";
  std::set<std::string> emittedMinNumbers;
  static std::string strNumMin = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  std::set<std::string> emittedMaxNumbers;
  static std::string strNumMax = "COMPATIBLE_INTERFACE_NUMBER_MAX";

  for(cmComputeLinkInformation::ItemVector::const_iterator li =
      deps.begin(); li != deps.end(); ++li)
    {
    if (!li->Target)
      {
      continue;
      }

    checkPropertyConsistency<bool>(this, li->Target,
                                strBool,
                                emittedBools, config, BoolType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strString,
                                emittedStrings, config,
                                StringType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMin,
                                emittedMinNumbers, config,
                                NumberMinType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    checkPropertyConsistency<const char *>(this, li->Target,
                                strNumMax,
                                emittedMaxNumbers, config,
                                NumberMaxType, 0);
    if (cmSystemTools::GetErrorOccuredFlag())
      {
      return;
      }
    }

  std::string prop = intersect(emittedBools,
                               emittedStrings,
                               emittedMinNumbers,
                               emittedMaxNumbers);

  if (!prop.empty())
    {
    // Use a sorted std::vector to keep the error message sorted.
    std::vector<std::string> props;
    std::set<std::string>::const_iterator i = emittedBools.find(prop);
    if (i != emittedBools.end())
      {
      props.push_back(strBool);
      }
    i = emittedStrings.find(prop);
    if (i != emittedStrings.end())
      {
      props.push_back(strString);
      }
    i = emittedMinNumbers.find(prop);
    if (i != emittedMinNumbers.end())
      {
      props.push_back(strNumMin);
      }
    i = emittedMaxNumbers.find(prop);
    if (i != emittedMaxNumbers.end())
      {
      props.push_back(strNumMax);
      }
    std::sort(props.begin(), props.end());

    std::string propsString = cmJoin(cmMakeRange(props).retreat(1), ", ");
    propsString += " and the " + props.back();

    std::ostringstream e;
    e << "Property \"" << prop << "\" appears in both the "
      << propsString <<
    " property in the dependencies of target \"" << this->GetName() <<
    "\".  This is not allowed. A property may only require compatibility "
    "in a boolean interpretation, a numeric minimum, a numeric maximum or a "
    "string interpretation, but not a mixture.";
    this->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
}